

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  re_group_register *in_R9;
  int ret2;
  int ret1;
  re_group_register regs2 [10];
  re_group_register regs1 [10];
  re_machine sub_machine;
  int match;
  int boundary;
  int next_is_word;
  int prev_is_word;
  size_t reg_len;
  re_group_register *group_reg;
  int group_num;
  re_tuple *tuple;
  size_t curlen;
  char *p;
  re_state_id cur_state;
  bool local_1da;
  bool local_1d9;
  undefined1 local_1c8 [160];
  undefined1 local_128 [160];
  re_registers local_88;
  ulong local_70;
  re_group_register *local_68;
  int local_5c;
  re_tuple *local_58;
  ulong local_50;
  byte *local_48;
  uint local_3c;
  re_group_register *local_38;
  re_registers *local_30;
  ulong local_28;
  byte *local_20;
  byte *local_18;
  re_context *local_10;
  int local_4;
  
  local_48 = (byte *)CONCAT44(in_register_00000014,__length);
  local_50 = CONCAT44(in_register_0000000c,__start);
  local_3c = __regs->num_regs;
  local_38 = in_R9;
  local_30 = __regs;
  local_28 = local_50;
  local_20 = local_48;
  local_18 = (byte *)__string;
  local_10 = (re_context *)__buffer;
  re_note_group((re_context *)__buffer,in_R9,local_3c,(char *)local_48);
  if (local_3c == *(uint *)&local_30->field_0x4) {
    local_4 = 0;
  }
  else {
    do {
      local_58 = local_10->tuple_arr + (int)local_3c;
      re_note_group(local_10,local_38,local_3c,(char *)local_48);
      if (((local_58->flags & 6) == 0) && (local_58->ch != '\x01')) {
        switch(local_58->ch) {
        case '\x02':
          if (local_50 == 0) {
            return -1;
          }
          local_48 = local_48 + 1;
          local_50 = local_50 - 1;
          break;
        case '\x03':
          if (local_48 != local_18) {
            return -1;
          }
          break;
        case '\x04':
          if (local_50 != 0) {
            return -1;
          }
          break;
        case '\x05':
          if ((local_48 != local_18) && (iVar1 = re_is_word_char('\0'), iVar1 != 0)) {
            return -1;
          }
          if ((local_50 == 0) || (iVar1 = re_is_word_char('\0'), iVar1 == 0)) {
            return -1;
          }
          break;
        case '\x06':
          if ((local_50 != 0) && (iVar1 = re_is_word_char('\0'), iVar1 != 0)) {
            return -1;
          }
          if ((local_48 == local_18) || (iVar1 = re_is_word_char('\0'), iVar1 == 0)) {
            return -1;
          }
          break;
        case '\a':
          if ((local_50 == 0) || (iVar1 = re_is_word_char('\0'), iVar1 == 0)) {
            return -1;
          }
          local_48 = local_48 + 1;
          local_50 = local_50 - 1;
          break;
        case '\b':
          if ((local_50 == 0) || (iVar1 = re_is_word_char('\0'), iVar1 != 0)) {
            return -1;
          }
          local_48 = local_48 + 1;
          local_50 = local_50 - 1;
          break;
        case '\t':
        case '\n':
          local_1d9 = false;
          if (local_48 != local_18) {
            iVar1 = re_is_word_char('\0');
            local_1d9 = iVar1 != 0;
          }
          local_88.end._4_4_ = (uint)local_1d9;
          local_1da = false;
          if (local_50 != 0) {
            iVar1 = re_is_word_char('\0');
            local_1da = iVar1 != 0;
          }
          local_88.end._0_4_ = (uint)local_1da;
          local_88.start._4_4_ = (uint)((local_88.end._4_4_ != 0) != ((uint)local_88.end != 0));
          if (((local_58->ch == '\t') && (local_88.start._4_4_ == 0)) ||
             ((local_58->ch == '\n' && (local_88.start._4_4_ != 0)))) {
            return -1;
          }
          break;
        case '\v':
        case '\f':
          if (local_50 == 0) {
            return -1;
          }
          local_88.start._0_4_ =
               (uint)(((uint)local_58->char_range[(int)(uint)*local_48 >> 3] & 1 << (*local_48 & 7))
                     != 0);
          if (((local_58->ch == '\v') && ((uint)local_88.start == 0)) ||
             ((local_58->ch == '\f' && ((uint)local_88.start != 0)))) {
            return -1;
          }
          local_48 = local_48 + 1;
          local_50 = local_50 - 1;
          break;
        case '\r':
        case '\x0e':
        case '\x0f':
        case '\x10':
        case '\x11':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x15':
        case '\x16':
          local_5c = local_58->ch + -0xd;
          local_68 = local_38 + local_5c;
          if ((local_68->start_ofs == (char *)0x0) || (local_68->end_ofs == (char *)0x0)) {
            return -1;
          }
          local_70 = (long)local_68->end_ofs - (long)local_68->start_ofs;
          if (local_50 < local_70) {
            return -1;
          }
          iVar1 = memcmp(local_48,local_68->start_ofs,local_70);
          if (iVar1 != 0) {
            return -1;
          }
          local_48 = local_48 + local_70;
          local_50 = local_50 - local_70;
          break;
        default:
          if ((local_50 == 0) || (local_58->ch != *local_48)) {
            return -1;
          }
          local_48 = local_48 + 1;
          local_50 = local_50 - 1;
        }
        local_3c = local_58->next_state_1;
      }
      else {
        if (local_58->next_state_2 != -1) {
          memcpy(local_128,local_38,0xa0);
          local_88.num_regs = local_58->next_state_1;
          local_88._4_4_ = *(undefined4 *)&local_30->field_0x4;
          iVar1 = re_match((re_pattern_buffer *)local_10,(char *)local_18,(int)local_48,
                           (int)local_50,&local_88);
          memcpy(local_1c8,local_38,0xa0);
          local_88.num_regs = local_58->next_state_2;
          local_88._4_4_ = *(undefined4 *)&local_30->field_0x4;
          iVar2 = re_match((re_pattern_buffer *)local_10,(char *)local_18,(int)local_48,
                           (int)local_50,&local_88);
          if ((iVar1 < 0) && (iVar2 < 0)) {
            return -1;
          }
          if (iVar2 < iVar1) {
            memcpy(local_38,local_128,0xa0);
            return iVar1 + ((int)local_48 - (int)local_20);
          }
          memcpy(local_38,local_1c8,0xa0);
          return iVar2 + ((int)local_48 - (int)local_20);
        }
        local_3c = local_58->next_state_1;
      }
    } while (local_3c != *(uint *)&local_30->field_0x4);
    re_note_group(local_10,local_38,local_3c,(char *)local_48);
    local_4 = (int)local_48 - (int)local_20;
  }
  return local_4;
}

Assistant:

static int re_match(re_context *ctx, const char *entire_str,
                    const char *str, size_t origlen,
                    const re_machine *machine, re_group_register *regs)
{
    re_state_id cur_state;
    const char *p;
    size_t curlen;

    /* start at the machine's initial state */
    cur_state = machine->init;

    /* start at the beginning of the string */
    p = str;
    curlen = origlen;

    /* note any group involved in the initial state */
    re_note_group(ctx, regs, cur_state, p);

    /* 
     *   if we're starting in the final state, immediately return success
     *   with a zero-length match 
     */
    if (cur_state == machine->final)
    {
        /* return success with a zero-length match */
        return 0;
    }

    /* run the machine */
    for (;;)
    {
        re_tuple *tuple;

        /* get the tuple for this state */
        tuple = &ctx->tuple_arr[cur_state];

        /* if this is a group state, adjust the group registers */
        re_note_group(ctx, regs, cur_state, p);
        
        /* see what kind of state we're in */
        if (!(tuple->flags & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
            && tuple->ch != RE_EPSILON)
        {
            /*
             *   This is a character or group recognizer state.  If we
             *   match the character or group, continue on to the next
             *   state; otherwise, return failure.
             */
            switch(tuple->ch)
            {
            case RE_GROUP_MATCH_0:
            case RE_GROUP_MATCH_0 + 1:
            case RE_GROUP_MATCH_0 + 2:
            case RE_GROUP_MATCH_0 + 3:
            case RE_GROUP_MATCH_0 + 4:
            case RE_GROUP_MATCH_0 + 5:
            case RE_GROUP_MATCH_0 + 6:
            case RE_GROUP_MATCH_0 + 7:
            case RE_GROUP_MATCH_0 + 8:
            case RE_GROUP_MATCH_0 + 9:
                {
                    int group_num;
                    re_group_register *group_reg;
                    size_t reg_len;
                    
                    /* it's a group - get the group number */
                    group_num = tuple->ch - RE_GROUP_MATCH_0;
                    group_reg = &regs[group_num];
                    
                    /* 
                     *   if this register isn't defined, there's nothing
                     *   to match, so fail 
                     */
                    if (group_reg->start_ofs == 0 || group_reg->end_ofs == 0)
                        return -1;
                    
                    /* calculate the length of the register value */
                    reg_len = group_reg->end_ofs - group_reg->start_ofs;
                    
                    /* if we don't have enough left to match, it fails */
                    if (curlen < reg_len)
                        return -1;
                    
                    /* if the string doesn't match exactly, we fail */
                    if (memcmp(p, group_reg->start_ofs, reg_len) != 0)
                        return -1;
                    
                    /*
                     *   It matches exactly - skip the entire length of
                     *   the register in the source string 
                     */
                    p += reg_len;
                    curlen -= reg_len;
                }
                break;

            case RE_TEXT_BEGIN:
                /* 
                 *   Match only the exact beginning of the string - if
                 *   we're anywhere else, this isn't a match.  If this
                 *   succeeds, we don't skip any characters.  
                 */
                if (p != entire_str)
                    return -1;
                break;

            case RE_TEXT_END:
                /*
                 *   Match only the exact end of the string - if we're
                 *   anywhere else, this isn't a match.  Don't skip any
                 *   characters on success.  
                 */
                if (curlen != 0)
                    return -1;
                break;

            case RE_WORD_BEGIN:
                /* 
                 *   if the previous character is a word character, we're
                 *   not at the beginning of a word 
                 */
                if (p != entire_str && re_is_word_char(*(p-1)))
                    return -1;

                /* 
                 *   if we're at the end of the string, or the current
                 *   character isn't the start of a word, we're not at the
                 *   beginning of a word 
                 */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;
                break;

            case RE_WORD_END:
                /*
                 *   if the current character is a word character, we're not
                 *   at the end of a word 
                 */
                if (curlen != 0 && re_is_word_char(*p))
                    return -1;

                /*
                 *   if we're at the beginning of the string, or the
                 *   previous character is not a word character, we're not
                 *   at the end of a word 
                 */
                if (p == entire_str || !re_is_word_char(*(p-1)))
                    return -1;
                break;

            case RE_WORD_CHAR:
                /* if it's not a word character, it's a failure */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;

                /* skip this character of input */
                ++p;
                --curlen;
                break;

            case RE_NON_WORD_CHAR:
                /* if it's a word character, it's a failure */
                if (curlen == 0 || re_is_word_char(*p))
                    return -1;

                /* skip the input */
                ++p;
                --curlen;
                break;

            case RE_WORD_BOUNDARY:
            case RE_NON_WORD_BOUNDARY:
                {
                    int prev_is_word;
                    int next_is_word;
                    int boundary;

                    /*
                     *   Determine if the previous character is a word
                     *   character -- if we're at the beginning of the
                     *   string, it's obviously not, otherwise check its
                     *   classification 
                     */
                    prev_is_word = (p != entire_str
                                    && re_is_word_char(*(p-1)));

                    /* make the same check for the current character */
                    next_is_word = (curlen != 0
                                    && re_is_word_char(*p));

                    /*
                     *   Determine if this is a boundary - it is if the
                     *   two states are different 
                     */
                    boundary = ((prev_is_word != 0) ^ (next_is_word != 0));

                    /* 
                     *   make sure it matches what was desired, and return
                     *   failure if not 
                     */
                    if ((tuple->ch == RE_WORD_BOUNDARY && !boundary)
                        || (tuple->ch == RE_NON_WORD_BOUNDARY && boundary))
                        return -1;
                }
                break;

            case RE_WILDCARD:
                /* make sure we have a character to match */
                if (curlen == 0)
                    return -1;

                /* skip this character */
                ++p;
                --curlen;
                break;

            case RE_RANGE:
            case RE_RANGE_EXCL:
                {
                    int match;
                    
                    /* make sure we have a character to match */
                    if (curlen == 0)
                        return -1;
                    
                    /* see if we match */
                    match = re_is_bit_set(tuple->char_range,
                                          (int)(unsigned char)*p);
                    
                    /* make sure we got what we wanted */
                    if ((tuple->ch == RE_RANGE && !match)
                        || (tuple->ch == RE_RANGE_EXCL && match))
                        return -1;

                    /* skip this character of the input */
                    ++p;
                    --curlen;
                }
                break;

            default:
                /* make sure we have an exact match */
                if (curlen == 0 || tuple->ch != *p)
                    return -1;

                /* skip this character of the input */
                ++p;
                --curlen;
                break;
            }

            /* 
             *   if we got this far, we were successful - move on to the
             *   next state 
             */
            cur_state = tuple->next_state_1;
        }
        else if (tuple->next_state_2 == RE_STATE_INVALID)
        {
            /*
             *   We have only one transition, so this state is entirely
             *   deterministic.  Simply move on to the next state. 
             */
            cur_state = tuple->next_state_1;
        }
        else
        {
            re_machine sub_machine;
            re_group_register regs1[RE_GROUP_REG_CNT];
            re_group_register regs2[RE_GROUP_REG_CNT];
            int ret1;
            int ret2;
            
            /*
             *   This state has two possible transitions, and we don't
             *   know which one to take.  So, try both, see which one
             *   works better, and return the result.  Try the first
             *   transition first.  Note that each separate attempt must
             *   use a separate copy of the registers.  
             */
            memcpy(regs1, regs, sizeof(regs1));
            sub_machine.init = tuple->next_state_1;
            sub_machine.final = machine->final;
            ret1 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs1);

            /*
             *   Now try the second transition 
             */
            memcpy(regs2, regs, sizeof(regs2));
            sub_machine.init = tuple->next_state_2;
            sub_machine.final = machine->final;
            ret2 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs2);

            /*
             *   If they both failed, the whole thing failed.  Otherwise,
             *   return the longer of the two, plus the length we
             *   ourselves matched previously.  Note that we return the
             *   register set from the winning match.  
             */
            if (ret1 < 0 && ret2 < 0)
            {
                /* they both failed */
                return -1;
            }
            else if (ret1 > ret2)
            {
                /* use the first register set and result length */
                memcpy(regs, regs1, sizeof(regs1));
                return ret1 + (p - str);
            }
            else
            {
                /* use the second register set and result length */
                memcpy(regs, regs2, sizeof(regs2));
                return ret2 + (p - str);
            }
        }

        /*
         *   If we're in the final state, return success 
         */
        if (cur_state == machine->final)
        {
            /* finish off any group involved in the final state */
            re_note_group(ctx, regs, cur_state, p);
            
            /* return the length we matched */
            return p - str;
        }
    }
}